

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnBrIfExpr(BinaryReaderInterp *this,Index depth)

{
  Index index;
  bool bVar1;
  Result RVar2;
  Offset fixup_offset;
  Offset fixup;
  Location local_b8;
  Var local_98;
  Location local_50;
  Enum local_2c;
  Index local_28;
  Index local_24;
  Index catch_drop_count;
  Index keep_count;
  Index drop_count;
  Index depth_local;
  BinaryReaderInterp *this_local;
  
  keep_count = depth;
  _drop_count = this;
  GetLocation(&local_50,this);
  index = keep_count;
  GetLocation(&local_b8,this);
  Var::Var(&local_98,index,&local_b8);
  local_2c = (Enum)SharedValidator::OnBrIf(&this->validator_,&local_50,&local_98);
  bVar1 = Failed((Result)local_2c);
  Var::~Var(&local_98);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    RVar2 = GetBrDropKeepCount(this,keep_count,&catch_drop_count,&local_24);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      RVar2 = SharedValidator::GetCatchCount(&this->validator_,keep_count,&local_28);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        Istream::Emit(this->istream_,InterpBrUnless);
        fixup_offset = Istream::EmitFixupU32(this->istream_);
        EmitBr(this,keep_count,catch_drop_count,local_24,local_28);
        Istream::ResolveFixupU32(this->istream_,fixup_offset);
        Result::Result((Result *)((long)&this_local + 4),Ok);
      }
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnBrIfExpr(Index depth) {
  Index drop_count, keep_count, catch_drop_count;
  CHECK_RESULT(validator_.OnBrIf(GetLocation(), Var(depth, GetLocation())));
  CHECK_RESULT(GetBrDropKeepCount(depth, &drop_count, &keep_count));
  CHECK_RESULT(validator_.GetCatchCount(depth, &catch_drop_count));
  // Flip the br_if so if <cond> is true it can drop values from the stack.
  istream_.Emit(Opcode::InterpBrUnless);
  auto fixup = istream_.EmitFixupU32();
  EmitBr(depth, drop_count, keep_count, catch_drop_count);
  istream_.ResolveFixupU32(fixup);
  return Result::Ok;
}